

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_style_item *
nk_draw_button(nk_command_buffer *out,nk_rect *bounds,nk_flags state,nk_style_button *style)

{
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_style_item *in_RCX;
  uint in_EDX;
  nk_image *in_RSI;
  nk_command_buffer *in_RDI;
  nk_style_item *background;
  undefined4 in_stack_00000010;
  nk_style_item *local_28;
  
  if ((in_EDX & 0x10) == 0) {
    local_28 = in_RCX;
    if ((in_EDX & 0x20) != 0) {
      local_28 = in_RCX + 2;
    }
  }
  else {
    local_28 = in_RCX + 1;
  }
  if (local_28->type == NK_STYLE_ITEM_IMAGE) {
    r.w = (float)in_stack_00000010;
    r._0_8_ = style;
    r.h = (float)state;
    nk_draw_image(in_RDI,r,in_RSI,background._4_4_);
  }
  else {
    rect.w = (float)in_stack_00000010;
    rect._0_8_ = style;
    rect.h = (float)state;
    nk_fill_rect(in_RDI,rect,(float)((ulong)in_RSI >> 0x20),background._4_4_);
    rect_00.w = (float)in_stack_00000010;
    rect_00._0_8_ = style;
    rect_00.h = (float)state;
    nk_stroke_rect(in_RDI,rect_00,(float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),background._4_4_);
  }
  return local_28;
}

Assistant:

NK_LIB const struct nk_style_item*
nk_draw_button(struct nk_command_buffer *out,
const struct nk_rect *bounds, nk_flags state,
const struct nk_style_button *style)
{
const struct nk_style_item *background;
if (state & NK_WIDGET_STATE_HOVER)
background = &style->hover;
else if (state & NK_WIDGET_STATE_ACTIVED)
background = &style->active;
else background = &style->normal;

if (background->type == NK_STYLE_ITEM_IMAGE) {
nk_draw_image(out, *bounds, &background->data.image, nk_white);
} else {
nk_fill_rect(out, *bounds, style->rounding, background->data.color);
nk_stroke_rect(out, *bounds, style->rounding, style->border, style->border_color);
}
return background;
}